

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_functions.hpp
# Opt level: O0

void test_quadrature<RadialGaussian,IntegratorXX::RadialTransformQuadrature<IntegratorXX::UniformTrapezoid<double,double>,IntegratorXX::MurrayHandyLamingRadialTraits<2ul>>>
               (string *msg,
               RadialTransformQuadrature<IntegratorXX::UniformTrapezoid<double,_double>,_IntegratorXX::MurrayHandyLamingRadialTraits<2UL>_>
               *quad,double ref,double e)

{
  double dVar1;
  ulong uVar2;
  size_t sVar3;
  const_reference pvVar4;
  WithinAbsMatcher *matcher;
  double dVar5;
  string local_158;
  WithinAbsMatcher local_138;
  MatchExpr<double_&,_IntegratorXX::Matchers::WithinAbsMatcher> local_e0;
  StringRef local_c0;
  undefined1 local_b0 [32];
  undefined1 local_90 [8];
  AssertionHandler catchAssertionHandler;
  double dStack_40;
  int i;
  double res;
  weight_container *wgt;
  point_container *pts;
  double e_local;
  double ref_local;
  RadialTransformQuadrature<IntegratorXX::UniformTrapezoid<double,_double>,_IntegratorXX::MurrayHandyLamingRadialTraits<2UL>_>
  *quad_local;
  string *msg_local;
  
  pts = (point_container *)e;
  e_local = ref;
  ref_local = (double)quad;
  quad_local = (RadialTransformQuadrature<IntegratorXX::UniformTrapezoid<double,_double>,_IntegratorXX::MurrayHandyLamingRadialTraits<2UL>_>
                *)msg;
  wgt = IntegratorXX::
        QuadratureBase<std::vector<double,_std::allocator<double>_>,_std::vector<double,_std::allocator<double>_>_>
        ::points((QuadratureBase<std::vector<double,_std::allocator<double>_>,_std::vector<double,_std::allocator<double>_>_>
                  *)quad);
  res = (double)IntegratorXX::
                QuadratureBase<std::vector<double,_std::allocator<double>_>,_std::vector<double,_std::allocator<double>_>_>
                ::weights((QuadratureBase<std::vector<double,_std::allocator<double>_>,_std::vector<double,_std::allocator<double>_>_>
                           *)ref_local);
  dStack_40 = 0.0;
  catchAssertionHandler.m_resultCapture._4_4_ = 0;
  while( true ) {
    uVar2 = (ulong)catchAssertionHandler.m_resultCapture._4_4_;
    sVar3 = IntegratorXX::
            QuadratureBase<std::vector<double,_std::allocator<double>_>,_std::vector<double,_std::allocator<double>_>_>
            ::npts((QuadratureBase<std::vector<double,_std::allocator<double>_>,_std::vector<double,_std::allocator<double>_>_>
                    *)ref_local);
    if (sVar3 <= uVar2) break;
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)res,
                        (long)catchAssertionHandler.m_resultCapture._4_4_);
    dVar1 = *pvVar4;
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                       (wgt,(long)catchAssertionHandler.m_resultCapture._4_4_);
    dVar5 = RadialGaussian::evaluate(*pvVar4);
    dStack_40 = dVar1 * dVar5 + dStack_40;
    catchAssertionHandler.m_resultCapture._4_4_ = catchAssertionHandler.m_resultCapture._4_4_ + 1;
  }
  local_b0._16_16_ = (undefined1  [16])operator____catch_sr("REQUIRE_THAT",0xc);
  matcher = (WithinAbsMatcher *)local_b0;
  Catch::SourceLineInfo::SourceLineInfo
            ((SourceLineInfo *)matcher,
             "/workspace/llm4binary/github/license_all_cmakelists_25/wavefunction91[P]IntegratorXX/test/test_functions.hpp"
             ,0x79);
  local_c0 = operator____catch_sr("res, IntegratorXX::Matchers::WithinAbs(msg, ref, e)",0x33);
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_90,(StringRef)local_b0._16_16_,(SourceLineInfo *)matcher,
             local_c0,Normal);
  std::__cxx11::string::string((string *)&local_158,(string *)msg);
  IntegratorXX::Matchers::WithinAbs(&local_138,&local_158,e_local,(double)pts);
  Catch::makeMatchExpr<double&,IntegratorXX::Matchers::WithinAbsMatcher>
            (&local_e0,(Catch *)&stack0xffffffffffffffc0,(double *)&local_138,matcher);
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_90,&local_e0.super_ITransientExpression);
  Catch::MatchExpr<double_&,_IntegratorXX::Matchers::WithinAbsMatcher>::~MatchExpr(&local_e0);
  IntegratorXX::Matchers::WithinAbsMatcher::~WithinAbsMatcher(&local_138);
  std::__cxx11::string::~string((string *)&local_158);
  Catch::AssertionHandler::complete((AssertionHandler *)local_90);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)local_90);
  return;
}

Assistant:

void test_quadrature(std::string msg, const QuadType& quad, double ref, double e, PreArgs&&... args) {
  const auto& pts = quad.points();
  const auto& wgt = quad.weights();

  double res = 0.0;
  for(auto i = 0; i < quad.npts(); ++i) {
    res += wgt[i] * TestFunction::evaluate(args..., pts[i]);
  }
  
  //standard_matcher(mes, res, ref, e);
  //printf("diff = %.6e\n", std::abs(ref - res));
  REQUIRE_THAT(res, IntegratorXX::Matchers::WithinAbs(msg, ref, e));
}